

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::wstring,unsigned_int>,true>::
set_value_of_empty_bucket<std::pair<std::__cxx11::wstring,unsigned_int>>
          (bucket_entry<std::pair<std::__cxx11::wstring,unsigned_int>,true> *this,
          distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
          *value_type_args)

{
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
  *value_type_args_local;
  truncated_hash_type hash_local;
  distance_type dist_from_ideal_bucket_local;
  bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
  *this_local;
  
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
  ::pair((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
          *)(this + 8),value_type_args);
  bucket_entry_hash<true>::set_hash((bucket_entry_hash<true> *)this,hash);
  *(distance_type *)(this + 4) = dist_from_ideal_bucket;
  return;
}

Assistant:

void set_value_of_empty_bucket(distance_type dist_from_ideal_bucket, 
                                   truncated_hash_type hash, Args&&... value_type_args) 
    {
        tsl_assert(dist_from_ideal_bucket >= 0);
        tsl_assert(empty());
        
        ::new (static_cast<void*>(std::addressof(m_value))) value_type(std::forward<Args>(value_type_args)...);
        this->set_hash(hash);
        m_dist_from_ideal_bucket = dist_from_ideal_bucket;
        
        tsl_assert(!empty());
    }